

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O0

void __thiscall icu_63::DateFormatSymbols::dispose(DateFormatSymbols *this)

{
  UnicodeString *pUVar1;
  UnicodeString *pUVar2;
  void *in_RSI;
  DateFormatSymbols *this_local;
  
  pUVar1 = this->fEras;
  if (pUVar1 != (UnicodeString *)0x0) {
    pUVar2 = pUVar1 + *(long *)((long)&pUVar1[-1].fUnion + 0x30);
    while (pUVar1 != pUVar2) {
      pUVar2 = pUVar2 + -1;
      icu_63::UnicodeString::~UnicodeString(pUVar2);
    }
    UMemory::operator_delete__((UMemory *)((long)&pUVar1[-1].fUnion + 0x30),in_RSI);
  }
  pUVar1 = this->fEraNames;
  if (pUVar1 != (UnicodeString *)0x0) {
    pUVar2 = pUVar1 + *(long *)((long)&pUVar1[-1].fUnion + 0x30);
    while (pUVar1 != pUVar2) {
      pUVar2 = pUVar2 + -1;
      icu_63::UnicodeString::~UnicodeString(pUVar2);
    }
    UMemory::operator_delete__((UMemory *)((long)&pUVar1[-1].fUnion + 0x30),in_RSI);
  }
  pUVar1 = this->fNarrowEras;
  if (pUVar1 != (UnicodeString *)0x0) {
    pUVar2 = pUVar1 + *(long *)((long)&pUVar1[-1].fUnion + 0x30);
    while (pUVar1 != pUVar2) {
      pUVar2 = pUVar2 + -1;
      icu_63::UnicodeString::~UnicodeString(pUVar2);
    }
    UMemory::operator_delete__((UMemory *)((long)&pUVar1[-1].fUnion + 0x30),in_RSI);
  }
  pUVar1 = this->fMonths;
  if (pUVar1 != (UnicodeString *)0x0) {
    pUVar2 = pUVar1 + *(long *)((long)&pUVar1[-1].fUnion + 0x30);
    while (pUVar1 != pUVar2) {
      pUVar2 = pUVar2 + -1;
      icu_63::UnicodeString::~UnicodeString(pUVar2);
    }
    UMemory::operator_delete__((UMemory *)((long)&pUVar1[-1].fUnion + 0x30),in_RSI);
  }
  pUVar1 = this->fShortMonths;
  if (pUVar1 != (UnicodeString *)0x0) {
    pUVar2 = pUVar1 + *(long *)((long)&pUVar1[-1].fUnion + 0x30);
    while (pUVar1 != pUVar2) {
      pUVar2 = pUVar2 + -1;
      icu_63::UnicodeString::~UnicodeString(pUVar2);
    }
    UMemory::operator_delete__((UMemory *)((long)&pUVar1[-1].fUnion + 0x30),in_RSI);
  }
  pUVar1 = this->fNarrowMonths;
  if (pUVar1 != (UnicodeString *)0x0) {
    pUVar2 = pUVar1 + *(long *)((long)&pUVar1[-1].fUnion + 0x30);
    while (pUVar1 != pUVar2) {
      pUVar2 = pUVar2 + -1;
      icu_63::UnicodeString::~UnicodeString(pUVar2);
    }
    UMemory::operator_delete__((UMemory *)((long)&pUVar1[-1].fUnion + 0x30),in_RSI);
  }
  pUVar1 = this->fStandaloneMonths;
  if (pUVar1 != (UnicodeString *)0x0) {
    pUVar2 = pUVar1 + *(long *)((long)&pUVar1[-1].fUnion + 0x30);
    while (pUVar1 != pUVar2) {
      pUVar2 = pUVar2 + -1;
      icu_63::UnicodeString::~UnicodeString(pUVar2);
    }
    UMemory::operator_delete__((UMemory *)((long)&pUVar1[-1].fUnion + 0x30),in_RSI);
  }
  pUVar1 = this->fStandaloneShortMonths;
  if (pUVar1 != (UnicodeString *)0x0) {
    pUVar2 = pUVar1 + *(long *)((long)&pUVar1[-1].fUnion + 0x30);
    while (pUVar1 != pUVar2) {
      pUVar2 = pUVar2 + -1;
      icu_63::UnicodeString::~UnicodeString(pUVar2);
    }
    UMemory::operator_delete__((UMemory *)((long)&pUVar1[-1].fUnion + 0x30),in_RSI);
  }
  pUVar1 = this->fStandaloneNarrowMonths;
  if (pUVar1 != (UnicodeString *)0x0) {
    pUVar2 = pUVar1 + *(long *)((long)&pUVar1[-1].fUnion + 0x30);
    while (pUVar1 != pUVar2) {
      pUVar2 = pUVar2 + -1;
      icu_63::UnicodeString::~UnicodeString(pUVar2);
    }
    UMemory::operator_delete__((UMemory *)((long)&pUVar1[-1].fUnion + 0x30),in_RSI);
  }
  pUVar1 = this->fWeekdays;
  if (pUVar1 != (UnicodeString *)0x0) {
    pUVar2 = pUVar1 + *(long *)((long)&pUVar1[-1].fUnion + 0x30);
    while (pUVar1 != pUVar2) {
      pUVar2 = pUVar2 + -1;
      icu_63::UnicodeString::~UnicodeString(pUVar2);
    }
    UMemory::operator_delete__((UMemory *)((long)&pUVar1[-1].fUnion + 0x30),in_RSI);
  }
  pUVar1 = this->fShortWeekdays;
  if (pUVar1 != (UnicodeString *)0x0) {
    pUVar2 = pUVar1 + *(long *)((long)&pUVar1[-1].fUnion + 0x30);
    while (pUVar1 != pUVar2) {
      pUVar2 = pUVar2 + -1;
      icu_63::UnicodeString::~UnicodeString(pUVar2);
    }
    UMemory::operator_delete__((UMemory *)((long)&pUVar1[-1].fUnion + 0x30),in_RSI);
  }
  pUVar1 = this->fShorterWeekdays;
  if (pUVar1 != (UnicodeString *)0x0) {
    pUVar2 = pUVar1 + *(long *)((long)&pUVar1[-1].fUnion + 0x30);
    while (pUVar1 != pUVar2) {
      pUVar2 = pUVar2 + -1;
      icu_63::UnicodeString::~UnicodeString(pUVar2);
    }
    UMemory::operator_delete__((UMemory *)((long)&pUVar1[-1].fUnion + 0x30),in_RSI);
  }
  pUVar1 = this->fNarrowWeekdays;
  if (pUVar1 != (UnicodeString *)0x0) {
    pUVar2 = pUVar1 + *(long *)((long)&pUVar1[-1].fUnion + 0x30);
    while (pUVar1 != pUVar2) {
      pUVar2 = pUVar2 + -1;
      icu_63::UnicodeString::~UnicodeString(pUVar2);
    }
    UMemory::operator_delete__((UMemory *)((long)&pUVar1[-1].fUnion + 0x30),in_RSI);
  }
  pUVar1 = this->fStandaloneWeekdays;
  if (pUVar1 != (UnicodeString *)0x0) {
    pUVar2 = pUVar1 + *(long *)((long)&pUVar1[-1].fUnion + 0x30);
    while (pUVar1 != pUVar2) {
      pUVar2 = pUVar2 + -1;
      icu_63::UnicodeString::~UnicodeString(pUVar2);
    }
    UMemory::operator_delete__((UMemory *)((long)&pUVar1[-1].fUnion + 0x30),in_RSI);
  }
  pUVar1 = this->fStandaloneShortWeekdays;
  if (pUVar1 != (UnicodeString *)0x0) {
    pUVar2 = pUVar1 + *(long *)((long)&pUVar1[-1].fUnion + 0x30);
    while (pUVar1 != pUVar2) {
      pUVar2 = pUVar2 + -1;
      icu_63::UnicodeString::~UnicodeString(pUVar2);
    }
    UMemory::operator_delete__((UMemory *)((long)&pUVar1[-1].fUnion + 0x30),in_RSI);
  }
  pUVar1 = this->fStandaloneShorterWeekdays;
  if (pUVar1 != (UnicodeString *)0x0) {
    pUVar2 = pUVar1 + *(long *)((long)&pUVar1[-1].fUnion + 0x30);
    while (pUVar1 != pUVar2) {
      pUVar2 = pUVar2 + -1;
      icu_63::UnicodeString::~UnicodeString(pUVar2);
    }
    UMemory::operator_delete__((UMemory *)((long)&pUVar1[-1].fUnion + 0x30),in_RSI);
  }
  pUVar1 = this->fStandaloneNarrowWeekdays;
  if (pUVar1 != (UnicodeString *)0x0) {
    pUVar2 = pUVar1 + *(long *)((long)&pUVar1[-1].fUnion + 0x30);
    while (pUVar1 != pUVar2) {
      pUVar2 = pUVar2 + -1;
      icu_63::UnicodeString::~UnicodeString(pUVar2);
    }
    UMemory::operator_delete__((UMemory *)((long)&pUVar1[-1].fUnion + 0x30),in_RSI);
  }
  pUVar1 = this->fAmPms;
  if (pUVar1 != (UnicodeString *)0x0) {
    pUVar2 = pUVar1 + *(long *)((long)&pUVar1[-1].fUnion + 0x30);
    while (pUVar1 != pUVar2) {
      pUVar2 = pUVar2 + -1;
      icu_63::UnicodeString::~UnicodeString(pUVar2);
    }
    UMemory::operator_delete__((UMemory *)((long)&pUVar1[-1].fUnion + 0x30),in_RSI);
  }
  pUVar1 = this->fNarrowAmPms;
  if (pUVar1 != (UnicodeString *)0x0) {
    pUVar2 = pUVar1 + *(long *)((long)&pUVar1[-1].fUnion + 0x30);
    while (pUVar1 != pUVar2) {
      pUVar2 = pUVar2 + -1;
      icu_63::UnicodeString::~UnicodeString(pUVar2);
    }
    UMemory::operator_delete__((UMemory *)((long)&pUVar1[-1].fUnion + 0x30),in_RSI);
  }
  pUVar1 = this->fQuarters;
  if (pUVar1 != (UnicodeString *)0x0) {
    pUVar2 = pUVar1 + *(long *)((long)&pUVar1[-1].fUnion + 0x30);
    while (pUVar1 != pUVar2) {
      pUVar2 = pUVar2 + -1;
      icu_63::UnicodeString::~UnicodeString(pUVar2);
    }
    UMemory::operator_delete__((UMemory *)((long)&pUVar1[-1].fUnion + 0x30),in_RSI);
  }
  pUVar1 = this->fShortQuarters;
  if (pUVar1 != (UnicodeString *)0x0) {
    pUVar2 = pUVar1 + *(long *)((long)&pUVar1[-1].fUnion + 0x30);
    while (pUVar1 != pUVar2) {
      pUVar2 = pUVar2 + -1;
      icu_63::UnicodeString::~UnicodeString(pUVar2);
    }
    UMemory::operator_delete__((UMemory *)((long)&pUVar1[-1].fUnion + 0x30),in_RSI);
  }
  pUVar1 = this->fStandaloneQuarters;
  if (pUVar1 != (UnicodeString *)0x0) {
    pUVar2 = pUVar1 + *(long *)((long)&pUVar1[-1].fUnion + 0x30);
    while (pUVar1 != pUVar2) {
      pUVar2 = pUVar2 + -1;
      icu_63::UnicodeString::~UnicodeString(pUVar2);
    }
    UMemory::operator_delete__((UMemory *)((long)&pUVar1[-1].fUnion + 0x30),in_RSI);
  }
  pUVar1 = this->fStandaloneShortQuarters;
  if (pUVar1 != (UnicodeString *)0x0) {
    pUVar2 = pUVar1 + *(long *)((long)&pUVar1[-1].fUnion + 0x30);
    while (pUVar1 != pUVar2) {
      pUVar2 = pUVar2 + -1;
      icu_63::UnicodeString::~UnicodeString(pUVar2);
    }
    UMemory::operator_delete__((UMemory *)((long)&pUVar1[-1].fUnion + 0x30),in_RSI);
  }
  pUVar1 = this->fLeapMonthPatterns;
  if (pUVar1 != (UnicodeString *)0x0) {
    pUVar2 = pUVar1 + *(long *)((long)&pUVar1[-1].fUnion + 0x30);
    while (pUVar1 != pUVar2) {
      pUVar2 = pUVar2 + -1;
      icu_63::UnicodeString::~UnicodeString(pUVar2);
    }
    UMemory::operator_delete__((UMemory *)((long)&pUVar1[-1].fUnion + 0x30),in_RSI);
  }
  pUVar1 = this->fShortYearNames;
  if (pUVar1 != (UnicodeString *)0x0) {
    pUVar2 = pUVar1 + *(long *)((long)&pUVar1[-1].fUnion + 0x30);
    while (pUVar1 != pUVar2) {
      pUVar2 = pUVar2 + -1;
      icu_63::UnicodeString::~UnicodeString(pUVar2);
    }
    UMemory::operator_delete__((UMemory *)((long)&pUVar1[-1].fUnion + 0x30),in_RSI);
  }
  pUVar1 = this->fShortZodiacNames;
  if (pUVar1 != (UnicodeString *)0x0) {
    pUVar2 = pUVar1 + *(long *)((long)&pUVar1[-1].fUnion + 0x30);
    while (pUVar1 != pUVar2) {
      pUVar2 = pUVar2 + -1;
      icu_63::UnicodeString::~UnicodeString(pUVar2);
    }
    UMemory::operator_delete__((UMemory *)((long)&pUVar1[-1].fUnion + 0x30),in_RSI);
  }
  pUVar1 = this->fAbbreviatedDayPeriods;
  if (pUVar1 != (UnicodeString *)0x0) {
    pUVar2 = pUVar1 + *(long *)((long)&pUVar1[-1].fUnion + 0x30);
    while (pUVar1 != pUVar2) {
      pUVar2 = pUVar2 + -1;
      icu_63::UnicodeString::~UnicodeString(pUVar2);
    }
    UMemory::operator_delete__((UMemory *)((long)&pUVar1[-1].fUnion + 0x30),in_RSI);
  }
  pUVar1 = this->fWideDayPeriods;
  if (pUVar1 != (UnicodeString *)0x0) {
    pUVar2 = pUVar1 + *(long *)((long)&pUVar1[-1].fUnion + 0x30);
    while (pUVar1 != pUVar2) {
      pUVar2 = pUVar2 + -1;
      icu_63::UnicodeString::~UnicodeString(pUVar2);
    }
    UMemory::operator_delete__((UMemory *)((long)&pUVar1[-1].fUnion + 0x30),in_RSI);
  }
  pUVar1 = this->fNarrowDayPeriods;
  if (pUVar1 != (UnicodeString *)0x0) {
    pUVar2 = pUVar1 + *(long *)((long)&pUVar1[-1].fUnion + 0x30);
    while (pUVar1 != pUVar2) {
      pUVar2 = pUVar2 + -1;
      icu_63::UnicodeString::~UnicodeString(pUVar2);
    }
    UMemory::operator_delete__((UMemory *)((long)&pUVar1[-1].fUnion + 0x30),in_RSI);
  }
  pUVar1 = this->fStandaloneAbbreviatedDayPeriods;
  if (pUVar1 != (UnicodeString *)0x0) {
    pUVar2 = pUVar1 + *(long *)((long)&pUVar1[-1].fUnion + 0x30);
    while (pUVar1 != pUVar2) {
      pUVar2 = pUVar2 + -1;
      icu_63::UnicodeString::~UnicodeString(pUVar2);
    }
    UMemory::operator_delete__((UMemory *)((long)&pUVar1[-1].fUnion + 0x30),in_RSI);
  }
  pUVar1 = this->fStandaloneWideDayPeriods;
  if (pUVar1 != (UnicodeString *)0x0) {
    pUVar2 = pUVar1 + *(long *)((long)&pUVar1[-1].fUnion + 0x30);
    while (pUVar1 != pUVar2) {
      pUVar2 = pUVar2 + -1;
      icu_63::UnicodeString::~UnicodeString(pUVar2);
    }
    UMemory::operator_delete__((UMemory *)((long)&pUVar1[-1].fUnion + 0x30),in_RSI);
  }
  pUVar1 = this->fStandaloneNarrowDayPeriods;
  if (pUVar1 != (UnicodeString *)0x0) {
    pUVar2 = pUVar1 + *(long *)((long)&pUVar1[-1].fUnion + 0x30);
    while (pUVar1 != pUVar2) {
      pUVar2 = pUVar2 + -1;
      icu_63::UnicodeString::~UnicodeString(pUVar2);
    }
    UMemory::operator_delete__((UMemory *)((long)&pUVar1[-1].fUnion + 0x30),in_RSI);
  }
  disposeZoneStrings(this);
  return;
}

Assistant:

void DateFormatSymbols::dispose()
{
    delete[] fEras;
    delete[] fEraNames;
    delete[] fNarrowEras;
    delete[] fMonths;
    delete[] fShortMonths;
    delete[] fNarrowMonths;
    delete[] fStandaloneMonths;
    delete[] fStandaloneShortMonths;
    delete[] fStandaloneNarrowMonths;
    delete[] fWeekdays;
    delete[] fShortWeekdays;
    delete[] fShorterWeekdays;
    delete[] fNarrowWeekdays;
    delete[] fStandaloneWeekdays;
    delete[] fStandaloneShortWeekdays;
    delete[] fStandaloneShorterWeekdays;
    delete[] fStandaloneNarrowWeekdays;
    delete[] fAmPms;
    delete[] fNarrowAmPms;
    delete[] fQuarters;
    delete[] fShortQuarters;
    delete[] fStandaloneQuarters;
    delete[] fStandaloneShortQuarters;
    delete[] fLeapMonthPatterns;
    delete[] fShortYearNames;
    delete[] fShortZodiacNames;
    delete[] fAbbreviatedDayPeriods;
    delete[] fWideDayPeriods;
    delete[] fNarrowDayPeriods;
    delete[] fStandaloneAbbreviatedDayPeriods;
    delete[] fStandaloneWideDayPeriods;
    delete[] fStandaloneNarrowDayPeriods;

    disposeZoneStrings();
}